

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceptance_tests.cpp
# Opt level: O1

void __thiscall
(anonymous_namespace)::AcceptanceTests_Load_Test::~AcceptanceTests_Load_Test
          (AcceptanceTests_Load_Test *this)

{
  testing::Test::~Test((Test *)(this + -0x10));
  operator_delete((Test *)(this + -0x10),0x18);
  return;
}

Assistant:

TEST_P(AcceptanceTests, Load) {
  const CcsTestCase &test = GetParam();
  std::cout << "Running test: " << test.name << std::endl;
  CcsDomain ccs;
  std::istringstream input(test.ccs);
  ccs.loadCcsStream(input, "<literal>", ImportResolver::None);
  CcsContext root = ccs.build();

  //ccs.logRuleDag(std::cout);
  //std::cout << std::endl;

  for (auto it = test.assertions.cbegin(); it != test.assertions.cend(); ++it) {
    CcsContext ctx = root;
    auto &cs = it->constraints;
    for (auto it2 = cs.cbegin(); it2 != cs.cend(); ++it2) {
      CcsContext::Builder b = ctx.builder();
      for (auto it3 = it2->cbegin(); it3 != it2->cend(); ++it3)
        b.add(it3->first, it3->second);
      ctx = b.build();
    }
    ASSERT_NO_THROW(EXPECT_EQ(it->value, ctx.getString(it->property)));
  }
}